

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Endpoints.cpp
# Opt level: O0

bool soul::isMIDIMessageStruct(Type *type)

{
  basic_string_view<char,_std::char_traits<char>_> __x;
  bool bVar1;
  uint32_t uVar2;
  MemberNameAndType *pMVar3;
  bool local_59;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_58;
  size_t local_48;
  char *local_40;
  string_view local_38;
  string_view local_28;
  Type *local_18;
  Type *type_local;
  
  local_18 = type;
  bVar1 = choc::value::Type::isObject(type);
  if (bVar1) {
    local_28 = choc::value::Type::getObjectClassName(local_18);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_38,"Message");
    bVar1 = choc::text::endsWith(local_28,local_38);
    local_59 = false;
    if (bVar1) {
      uVar2 = choc::value::Type::getNumElements(local_18);
      local_59 = false;
      if (uVar2 == 1) {
        pMVar3 = choc::value::Type::getObjectMember(local_18,0);
        local_48 = (pMVar3->name)._M_len;
        local_40 = (pMVar3->name)._M_str;
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (&local_58,"midiBytes");
        __x._M_str = local_40;
        __x._M_len = local_48;
        bVar1 = std::operator==(__x,local_58);
        local_59 = false;
        if (bVar1) {
          pMVar3 = choc::value::Type::getObjectMember(local_18,0);
          local_59 = choc::value::Type::isInt32(&pMVar3->type);
        }
      }
    }
    type_local._7_1_ = local_59;
  }
  else {
    type_local._7_1_ = false;
  }
  return type_local._7_1_;
}

Assistant:

bool isMIDIMessageStruct (const choc::value::Type& type)
{
    if (! type.isObject())
        return false;

    return choc::text::endsWith (type.getObjectClassName(), "Message")
            && type.getNumElements() == 1
            && type.getObjectMember (0).name == "midiBytes"
            && type.getObjectMember (0).type.isInt32();
}